

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O1

void __thiscall bloom_tests::merkle_block_4::test_method(merkle_block_4 *this)

{
  pointer puVar1;
  uint256 *puVar2;
  uchar *puVar3;
  bool bVar4;
  pointer puVar5;
  pointer ppVar6;
  pointer ppVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Span<const_std::byte> sp;
  Span<const_unsigned_char> vKey;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatched;
  DataStream stream;
  CBloomFilter filter;
  pair<unsigned_int,_uint256> pair;
  CBlock block;
  check_type cVar35;
  undefined1 *local_f40;
  undefined1 *local_f38;
  char *local_f30;
  char *local_f28;
  char *local_f20;
  char *local_f18;
  undefined1 *local_f10;
  undefined1 *local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  char *local_ee8;
  undefined1 *local_ee0;
  undefined1 *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_eb8;
  undefined1 *local_eb0;
  undefined1 *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e90;
  char *local_e88;
  undefined1 *local_e80;
  undefined1 *local_e78;
  char *local_e70;
  char *local_e68;
  char *local_e60;
  char *local_e58;
  undefined1 *local_e50;
  undefined1 *local_e48;
  char *local_e40;
  char *local_e38;
  char *local_e30;
  char *local_e28;
  undefined1 *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  char *local_de8;
  assertion_result local_de0;
  char **local_dc8;
  assertion_result local_dc0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  char *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  undefined1 *local_d48;
  undefined1 *local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 local_cf8 [16];
  pointer local_ce8;
  vector<uint256,_std::allocator<uint256>_> local_cd8;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  DataStream local_c00;
  CBloomFilter local_be0;
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [9];
  uchar uStack_b9f;
  uchar uStack_b9e;
  uchar uStack_b9d;
  uchar uStack_b9c;
  uchar uStack_b9b;
  uchar uStack_b9a;
  uchar uStack_b99;
  uint local_b68;
  _Bit_type *local_b60;
  uint uStack_b58;
  undefined4 uStack_b54;
  _Bit_type *local_b50;
  uint uStack_b48;
  undefined4 uStack_b44;
  _Bit_pointer local_b40;
  undefined1 local_b38 [16];
  pointer local_b28;
  bool local_b20;
  undefined1 local_b18 [16];
  pointer local_b08;
  undefined1 local_af8 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_af0;
  uchar uStack_ae0;
  uchar uStack_adf;
  uchar uStack_ade;
  uchar uStack_add;
  uchar uStack_adc;
  uchar uStack_adb;
  uchar uStack_ada;
  uchar uStack_ad9;
  undefined4 local_ad8;
  undefined1 local_ac8 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_ac0;
  undefined8 uStack_ab0;
  undefined1 local_aa8 [8];
  undefined8 uStack_aa0;
  uchar local_a98 [64];
  CPartialMerkleTree local_a58;
  pointer local_a08;
  pointer ppStack_a00;
  pointer local_9f8;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  pointer local_48;
  undefined3 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_dc0.m_message.pn.pi_ = (sp_counted_base *)local_dc0.m_message.px;
  local_48 = (pointer)0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_a8._16_16_ = (undefined1  [16])0x0;
  local_a8._0_16_ = (undefined1  [16])0x0;
  bVar16 = 0;
  uStack_40._0_1_ = false;
  uStack_40._1_1_ = false;
  uStack_40._2_1_ = false;
  memcpy(local_aa8,null_ARRAY_00e6ac70,0x9f2);
  sp.m_size = 0x9f2;
  sp.m_data = local_aa8;
  DataStream::DataStream(&local_c00,sp);
  local_aa8 = (undefined1  [8])&::TX_WITH_WITNESS;
  uStack_aa0 = &local_c00;
  CBlock::SerializationOps<ParamsStream<DataStream&,TransactionSerParams>,CBlock,ActionUnserialize>
            (local_a8);
  CBloomFilter::CBloomFilter(&local_be0,10,1e-06,0,'\x01');
  local_aa8._0_4_ = -0x20f53eac;
  local_aa8[4] = '\x15';
  local_aa8[5] = 0x9b;
  local_aa8[6] = 0xf1;
  local_aa8[7] = '\x18';
  uStack_aa0._0_1_ = 0xb8;
  uStack_aa0._1_1_ = 0xb2;
  uStack_aa0._2_1_ = 0xe6;
  uStack_aa0._3_1_ = ')';
  uStack_aa0._4_1_ = '\x14';
  uStack_aa0._5_1_ = '\x1a';
  uStack_aa0._6_1_ = 0xc6;
  uStack_aa0._7_1_ = 0xb5;
  local_a98[0] = 0xc6;
  local_a98[1] = 0x9a;
  local_a98[2] = 0xdd;
  local_a98[3] = 0xf4;
  local_a98[4] = 0xdd;
  local_a98[5] = 0xea;
  local_a98[6] = '\x13';
  local_a98[7] = '\n';
  local_a98[8] = '}';
  local_a98[9] = 'r';
  local_a98[10] = 0xa4;
  local_a98[0xb] = 0xbd;
  local_a98[0xc] = 0xf0;
  local_a98[0xd] = 0x92;
  local_a98[0xe] = '*';
  local_a98[0xf] = '\n';
  vKey.m_size = 0x20;
  vKey.m_data = local_aa8;
  CBloomFilter::insert(&local_be0,vKey);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)local_aa8,(CBlock *)local_a8,&local_be0,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  local_c10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x178;
  file.m_begin = (iterator)&local_c10;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c20,msg);
  CBlockHeader::GetHash((uint256 *)local_bb8,(CBlockHeader *)local_aa8);
  CBlockHeader::GetHash((uint256 *)local_af8,(CBlockHeader *)local_a8);
  auVar28[0] = -((uchar)sStack_af0.pn.pi_ == local_ba8[0]);
  auVar28[1] = -(sStack_af0.pn.pi_._1_1_ == local_ba8[1]);
  auVar28[2] = -(sStack_af0.pn.pi_._2_1_ == local_ba8[2]);
  auVar28[3] = -(sStack_af0.pn.pi_._3_1_ == local_ba8[3]);
  auVar28[4] = -(sStack_af0.pn.pi_._4_1_ == local_ba8[4]);
  auVar28[5] = -(sStack_af0.pn.pi_._5_1_ == local_ba8[5]);
  auVar28[6] = -(sStack_af0.pn.pi_._6_1_ == local_ba8[6]);
  auVar28[7] = -(sStack_af0.pn.pi_._7_1_ == local_ba8[7]);
  auVar28[8] = -(uStack_ae0 == local_ba8[8]);
  auVar28[9] = -(uStack_adf == uStack_b9f);
  auVar28[10] = -(uStack_ade == uStack_b9e);
  auVar28[0xb] = -(uStack_add == uStack_b9d);
  auVar28[0xc] = -(uStack_adc == uStack_b9c);
  auVar28[0xd] = -(uStack_adb == uStack_b9b);
  auVar28[0xe] = -(uStack_ada == uStack_b9a);
  auVar28[0xf] = -(uStack_ad9 == uStack_b99);
  auVar22[0] = -(local_af8[0] == (readonly_property<bool>)local_bb8[0]);
  auVar22[1] = -(local_af8[1] == local_bb8[1]);
  auVar22[2] = -(local_af8[2] == local_bb8[2]);
  auVar22[3] = -(local_af8[3] == local_bb8[3]);
  auVar22[4] = -(local_af8[4] == local_bb8[4]);
  auVar22[5] = -(local_af8[5] == local_bb8[5]);
  auVar22[6] = -(local_af8[6] == local_bb8[6]);
  auVar22[7] = -(local_af8[7] == local_bb8[7]);
  auVar22[8] = -((uchar)sStack_af0.px == local_bb8[8]);
  auVar22[9] = -(sStack_af0.px._1_1_ == local_bb8[9]);
  auVar22[10] = -(sStack_af0.px._2_1_ == local_bb8[10]);
  auVar22[0xb] = -(sStack_af0.px._3_1_ == local_bb8[0xb]);
  auVar22[0xc] = -(sStack_af0.px._4_1_ == local_bb8[0xc]);
  auVar22[0xd] = -(sStack_af0.px._5_1_ == local_bb8[0xd]);
  auVar22[0xe] = -(sStack_af0.px._6_1_ == local_bb8[0xe]);
  auVar22[0xf] = -(sStack_af0.px._7_1_ == local_bb8[0xf]);
  auVar22 = auVar22 & auVar28;
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xe69841;
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xe69870;
  sStack_ac0.px = (element_type *)(sStack_ac0._1_8_ << 8);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_ac0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c28 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_ab0 = (assertion_result *)&local_cd8;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar35,(size_t)&local_c30,0x178);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_c40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x17a;
  file_00.m_begin = (iterator)&local_c40;
  msg_00.m_end = pvVar12;
  msg_00.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_c50,
             msg_00);
  local_af8[0] = (readonly_property<bool>)
                 (readonly_property<bool>)((long)ppStack_a00 - (long)local_a08 == 0x24);
  sStack_af0.px = (element_type *)0x0;
  sStack_af0.pn.pi_ = (sp_counted_base *)0x0;
  local_ac8 = (undefined1  [8])0xe6995e;
  sStack_ac0.px = (element_type *)0xe69981;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffff460 = (assertion_result *)local_ac8;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_c60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c58 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_af8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_c60,0x17a);
  boost::detail::shared_count::~shared_count(&sStack_af0.pn);
  local_af8 = *(undefined1 (*) [8])local_a08;
  sStack_af0 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                ((local_a08->second).super_base_blob<256U>.m_data._M_elems + 4);
  _uStack_ae0 = *(undefined8 *)((local_a08->second).super_base_blob<256U>.m_data._M_elems + 0x14);
  local_ad8 = *(undefined4 *)((local_a08->second).super_base_blob<256U>.m_data._M_elems + 0x1c);
  local_c70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x17d;
  file_01.m_begin = (iterator)&local_c70;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_c80,
             msg_01);
  local_bb8._0_8_ = _DAT_00e691b0;
  local_bb8[8] = UNK_00e691b8;
  local_bb8._9_7_ = _UNK_00e691b9;
  _local_ba8 = _DAT_00e691c0;
  auVar23[0] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x10] == DAT_00e691c0);
  auVar23[1] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x11] ==
                DAT_00e691c0._1_1_);
  auVar23[2] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x12] ==
                DAT_00e691c0._2_1_);
  auVar23[3] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x13] ==
                DAT_00e691c0._3_1_);
  auVar23[4] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x14] ==
                DAT_00e691c0._4_1_);
  auVar23[5] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x15] ==
                DAT_00e691c0._5_1_);
  auVar23[6] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x16] ==
                DAT_00e691c0._6_1_);
  auVar23[7] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x17] ==
                DAT_00e691c0._7_1_);
  auVar23[8] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x18] ==
                DAT_00e691c0._8_1_);
  auVar23[9] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x19] ==
                DAT_00e691c0._9_1_);
  auVar23[10] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 DAT_00e691c0._10_1_);
  auVar23[0xb] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  DAT_00e691c0._11_1_);
  auVar23[0xc] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  DAT_00e691c0._12_1_);
  auVar23[0xd] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  DAT_00e691c0._13_1_);
  auVar23[0xe] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  DAT_00e691c0._14_1_);
  auVar23[0xf] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  DAT_00e691c0._15_1_);
  auVar17[0] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0] == DAT_00e691b0);
  auVar17[1] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[1] == DAT_00e691b0._1_1_)
  ;
  auVar17[2] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[2] == DAT_00e691b0._2_1_)
  ;
  auVar17[3] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[3] == DAT_00e691b0._3_1_)
  ;
  auVar17[4] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[4] == DAT_00e691b0._4_1_)
  ;
  auVar17[5] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[5] == DAT_00e691b0._5_1_)
  ;
  auVar17[6] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[6] == DAT_00e691b0._6_1_)
  ;
  auVar17[7] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[7] == DAT_00e691b0._7_1_)
  ;
  auVar17[8] = -((bool)(local_a08->second).super_base_blob<256U>.m_data._M_elems[8] ==
                DAT_00e691b0._8_1_);
  auVar17[9] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[9] == DAT_00e691b0._9_1_)
  ;
  auVar17[10] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[10] ==
                 DAT_00e691b0._10_1_);
  auVar17[0xb] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xb] ==
                  DAT_00e691b0._11_1_);
  auVar17[0xc] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xc] ==
                  DAT_00e691b0._12_1_);
  auVar17[0xd] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xd] ==
                  DAT_00e691b0._13_1_);
  auVar17[0xe] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xe] ==
                  DAT_00e691b0._14_1_);
  auVar17[0xf] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xf] ==
                  DAT_00e691b0._15_1_);
  auVar17 = auVar17 & auVar23;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)"";
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)
             "merkleBlock.vMatchedTxn[0].second == uint256{\"0a2a92f0bda4727d0a13eaddf4dd9ac6b5c61a1429e6b2b818f19b15df0ac154\"}"
  ;
  sStack_ac0.px = (element_type *)(sStack_ac0._1_8_ << 8);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_ac0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_c90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c88 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_ab0 = (assertion_result *)&local_cd8;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar35,(size_t)&local_c90,0x17d);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_ca0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_c98 = "";
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x17e;
  file_02.m_begin = (iterator)&local_ca0;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_cb0,
             msg_02);
  local_ac8[0] = (class_property<bool>)(class_property<bool>)(local_a08->first == 6);
  sStack_ac0.px = (element_type *)0x0;
  sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn[0].first == 6";
  local_de0.m_message.px = (element_type *)0xe69e5b;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffff460 = &local_de0;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_cc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_cb8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_cc0,0x17e);
  boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_ce8 = (pointer)0x0;
  local_cf8 = (undefined1  [16])0x0;
  local_d08 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_d00 = "";
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x182;
  file_03.m_begin = (iterator)&local_d08;
  msg_03.m_end = pvVar12;
  msg_03.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_d18,
             msg_03);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_bb8,&local_a58,&local_cd8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_cf8);
  auVar24[0] = -((class_property<bool>)local_88[4] == local_bb8[0]);
  auVar24[1] = -(local_88[5] == local_bb8[1]);
  auVar24[2] = -(local_88[6] == local_bb8[2]);
  auVar24[3] = -(local_88[7] == local_bb8[3]);
  auVar24[4] = -(local_88[8] == local_bb8[4]);
  auVar24[5] = -(local_88[9] == local_bb8[5]);
  auVar24[6] = -(local_88[10] == local_bb8[6]);
  auVar24[7] = -(local_88[0xb] == local_bb8[7]);
  auVar24[8] = -(local_88[0xc] == local_bb8[8]);
  auVar24[9] = -(local_88[0xd] == local_bb8[9]);
  auVar24[10] = -(local_88[0xe] == local_bb8[10]);
  auVar24[0xb] = -(local_88[0xf] == local_bb8[0xb]);
  auVar24[0xc] = -(local_78[0] == local_bb8[0xc]);
  auVar24[0xd] = -(local_78[1] == local_bb8[0xd]);
  auVar24[0xe] = -(local_78[2] == local_bb8[0xe]);
  auVar24[0xf] = -(local_78[3] == local_bb8[0xf]);
  auVar29[0] = -(local_78[4] == local_ba8[0]);
  auVar29[1] = -(local_78[5] == local_ba8[1]);
  auVar29[2] = -(local_78[6] == local_ba8[2]);
  auVar29[3] = -(local_78[7] == local_ba8[3]);
  auVar29[4] = -(local_78[8] == local_ba8[4]);
  auVar29[5] = -(local_78[9] == local_ba8[5]);
  auVar29[6] = -(local_78[10] == local_ba8[6]);
  auVar29[7] = -(local_78[0xb] == local_ba8[7]);
  auVar29[8] = -(local_78[0xc] == local_ba8[8]);
  auVar29[9] = -(local_78[0xd] == uStack_b9f);
  auVar29[10] = -(local_78[0xe] == uStack_b9e);
  auVar29[0xb] = -(local_78[0xf] == uStack_b9d);
  auVar29[0xc] = -(local_68[0] == uStack_b9c);
  auVar29[0xd] = -(local_68[1] == uStack_b9b);
  auVar29[0xe] = -(local_68[2] == uStack_b9a);
  auVar29[0xf] = -(local_68[3] == uStack_b99);
  auVar24 = auVar24 & auVar29;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff);
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  uStack_ab0 = &local_dc0;
  local_dc0._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_dc0.m_message.px = (element_type *)0xe697dd;
  sStack_ac0.px = (element_type *)(sStack_ac0._1_8_ << 8);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_ac0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d28 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_d20 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar35,(size_t)&local_d28,0x182);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_d38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_d30 = "";
  local_d48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x183;
  file_04.m_begin = (iterator)&local_d38;
  msg_04.m_end = pvVar12;
  msg_04.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_d48,
             msg_04);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)ppStack_a00 - (long)local_a08 >> 2) * -0x71c71c71c71c71c7);
  sStack_ac0.px = (element_type *)0x0;
  sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_de0.m_message.px = (element_type *)0xe6980f;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  unique0x00005300 = &local_de0;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_d58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_d50 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_d58,0x183);
  boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
  if (local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar13 = 1;
    uVar14 = 0;
    do {
      local_d68 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_d60 = "";
      local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
      local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x185;
      file_05.m_begin = (iterator)&local_d68;
      msg_05.m_end = pvVar12;
      msg_05.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_d78,
                 msg_05);
      puVar1 = local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      auVar17 = *(undefined1 (*) [16])
                 (local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems +
                 0x10);
      puVar2 = &local_a08[uVar14].second;
      auVar30[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
      auVar30[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
      auVar30[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
      auVar30[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
      auVar30[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
      auVar30[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
      auVar30[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
      auVar30[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
      auVar30[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
      auVar30[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
      auVar30[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
      auVar30[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar30[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar30[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar30[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar30[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = local_a08[uVar14].second.super_base_blob<256U>.m_data._M_elems + 0x10;
      auVar18[0] = -(*puVar3 == auVar17[0]);
      auVar18[1] = -(puVar3[1] == auVar17[1]);
      auVar18[2] = -(puVar3[2] == auVar17[2]);
      auVar18[3] = -(puVar3[3] == auVar17[3]);
      auVar18[4] = -(puVar3[4] == auVar17[4]);
      auVar18[5] = -(puVar3[5] == auVar17[5]);
      auVar18[6] = -(puVar3[6] == auVar17[6]);
      auVar18[7] = -(puVar3[7] == auVar17[7]);
      auVar18[8] = -(puVar3[8] == auVar17[8]);
      auVar18[9] = -(puVar3[9] == auVar17[9]);
      auVar18[10] = -(puVar3[10] == auVar17[10]);
      auVar18[0xb] = -(puVar3[0xb] == auVar17[0xb]);
      auVar18[0xc] = -(puVar3[0xc] == auVar17[0xc]);
      auVar18[0xd] = -(puVar3[0xd] == auVar17[0xd]);
      auVar18[0xe] = -(puVar3[0xe] == auVar17[0xe]);
      auVar18[0xf] = -(puVar3[0xf] == auVar17[0xf]);
      auVar18 = auVar18 & auVar30;
      local_ac8[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
      sStack_ac0.px = (element_type *)0x0;
      sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
      local_de0._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_de0.m_message.px = (element_type *)0xe69840;
      local_bb8[8] = 0;
      local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
      unique0x00005300 = &local_de0;
      local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
      local_d88 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_d80 = "";
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
                 (size_t)&local_d88,0x185);
      boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
      uVar14 = (ulong)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar14 < (ulong)((long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_bb8._8_8_ = 0x5a10f27a03cfd2de;
  local_bb8._0_8_ = (_func_int **)0x67326471df5bc041;
  stack0xfffffffffffff460 = (assertion_result *)0x2981fa052f0481d;
  local_ba8._0_8_ = 0xbc5868f4fc216603;
  vKey_00.m_size = 0x20;
  vKey_00.m_data = local_bb8;
  CBloomFilter::insert(&local_be0,vKey_00);
  CMerkleBlock::CMerkleBlock
            ((CMerkleBlock *)local_bb8,(CBlock *)local_a8,&local_be0,
             (set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
              *)0x0);
  puVar9 = (undefined8 *)local_bb8;
  puVar10 = (undefined8 *)local_aa8;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar10 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar16 * -2 + 1;
    puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
  }
  local_a58.nTransactions = local_b68;
  if (local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  puVar5 = local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar1 = local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_b40;
  local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_b54,uStack_b58);
  local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_b44,uStack_b48);
  local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = local_b50;
  local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = local_b60;
  local_b60 = (_Bit_type *)0x0;
  uStack_b58 = 0;
  local_b50 = (_Bit_type *)0x0;
  uStack_b48 = 0;
  local_b40 = (_Bit_pointer)0x0;
  local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b38._0_8_;
  local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b38._8_8_;
  local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_b28;
  local_b38 = (undefined1  [16])0x0;
  local_b28 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar5 - (long)puVar1);
  }
  ppVar7 = local_9f8;
  ppVar6 = local_a08;
  local_a58.fBad = local_b20;
  local_a08 = (pointer)local_b18._0_8_;
  ppStack_a00 = (pointer)local_b18._8_8_;
  local_9f8 = local_b08;
  local_b18 = (undefined1  [16])0x0;
  local_b08 = (pointer)0x0;
  if (ppVar6 != (pointer)0x0) {
    operator_delete(ppVar6,(long)ppVar7 - (long)ppVar6);
  }
  if ((pointer)local_b18._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b18._0_8_,(long)local_b08 - local_b18._0_8_);
  }
  if ((pointer)local_b38._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_b38._0_8_,(long)local_b28 - local_b38._0_8_);
  }
  if (local_b60 != (_Bit_type *)0x0) {
    operator_delete(local_b60,(long)local_b40 - (long)local_b60);
    local_b60 = (_Bit_type *)0x0;
    uStack_b58 = 0;
    local_b50 = (_Bit_type *)0x0;
    uStack_b48 = 0;
    local_b40 = (_Bit_pointer)0x0;
  }
  local_d98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_d90 = "";
  local_da8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x18a;
  file_06.m_begin = (iterator)&local_d98;
  msg_06.m_end = pvVar12;
  msg_06.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_da8,
             msg_06);
  CBlockHeader::GetHash((uint256 *)local_bb8,(CBlockHeader *)local_aa8);
  CBlockHeader::GetHash((uint256 *)local_ac8,(CBlockHeader *)local_a8);
  auVar31[0] = -((uchar)sStack_ac0.pn.pi_ == local_ba8[0]);
  auVar31[1] = -(sStack_ac0.pn.pi_._1_1_ == local_ba8[1]);
  auVar31[2] = -(sStack_ac0.pn.pi_._2_1_ == local_ba8[2]);
  auVar31[3] = -(sStack_ac0.pn.pi_._3_1_ == local_ba8[3]);
  auVar31[4] = -(sStack_ac0.pn.pi_._4_1_ == local_ba8[4]);
  auVar31[5] = -(sStack_ac0.pn.pi_._5_1_ == local_ba8[5]);
  auVar31[6] = -(sStack_ac0.pn.pi_._6_1_ == local_ba8[6]);
  auVar31[7] = -(sStack_ac0.pn.pi_._7_1_ == local_ba8[7]);
  auVar31[8] = -((uchar)uStack_ab0 == local_ba8[8]);
  auVar31[9] = -(uStack_ab0._1_1_ == uStack_b9f);
  auVar31[10] = -(uStack_ab0._2_1_ == uStack_b9e);
  auVar31[0xb] = -(uStack_ab0._3_1_ == uStack_b9d);
  auVar31[0xc] = -(uStack_ab0._4_1_ == uStack_b9c);
  auVar31[0xd] = -(uStack_ab0._5_1_ == uStack_b9b);
  auVar31[0xe] = -(uStack_ab0._6_1_ == uStack_b9a);
  auVar31[0xf] = -(uStack_ab0._7_1_ == uStack_b99);
  auVar25[0] = -(local_ac8[0] == local_bb8[0]);
  auVar25[1] = -(local_ac8[1] == local_bb8[1]);
  auVar25[2] = -(local_ac8[2] == local_bb8[2]);
  auVar25[3] = -(local_ac8[3] == local_bb8[3]);
  auVar25[4] = -(local_ac8[4] == local_bb8[4]);
  auVar25[5] = -(local_ac8[5] == local_bb8[5]);
  auVar25[6] = -(local_ac8[6] == local_bb8[6]);
  auVar25[7] = -(local_ac8[7] == local_bb8[7]);
  auVar25[8] = -(sStack_ac0.px._0_1_ == (bool)local_bb8[8]);
  auVar25[9] = -(sStack_ac0.px._1_1_ == local_bb8[9]);
  auVar25[10] = -(sStack_ac0.px._2_1_ == local_bb8[10]);
  auVar25[0xb] = -(sStack_ac0.px._3_1_ == local_bb8[0xb]);
  auVar25[0xc] = -(sStack_ac0.px._4_1_ == local_bb8[0xc]);
  auVar25[0xd] = -(sStack_ac0.px._5_1_ == local_bb8[0xd]);
  auVar25[0xe] = -(sStack_ac0.px._6_1_ == local_bb8[0xe]);
  auVar25[0xf] = -(sStack_ac0.px._7_1_ == local_bb8[0xf]);
  auVar25 = auVar25 & auVar31;
  local_dc0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff);
  local_dc0.m_message.px = (element_type *)0x0;
  local_dc0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_dc8 = &local_df0;
  local_df0 = "merkleBlock.header.GetHash() == block.GetHash()";
  local_de8 = "";
  local_de0.m_message.px = (element_type *)(local_de0.m_message._1_8_ << 8);
  local_de0._0_8_ = &PTR__lazy_ostream_013abc70;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_df8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_dc0,(lazy_ostream *)&local_de0,1,0,WARN,_cVar35,(size_t)&local_e00,0x18a);
  boost::detail::shared_count::~shared_count(&local_dc0.m_message.pn);
  local_e10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e08 = "";
  local_e20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x18c;
  file_07.m_begin = (iterator)&local_e10;
  msg_07.m_end = pvVar12;
  msg_07.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_e20,
             msg_07);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)((long)ppStack_a00 - (long)local_a08 == 0x48);
  sStack_ac0.px = (element_type *)0x0;
  sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn.size() == 2";
  local_de0.m_message.px = (element_type *)0xe69894;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffff460 = &local_de0;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_e30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e28 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_e30,0x18c);
  boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
  local_e40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e38 = "";
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x18e;
  file_08.m_begin = (iterator)&local_e40;
  msg_08.m_end = pvVar12;
  msg_08.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_e50,
             msg_08);
  local_bb8._0_8_ = _DAT_00e691d0;
  local_bb8[8] = UNK_00e691d8;
  local_bb8._9_7_ = _UNK_00e691d9;
  _local_ba8 = _DAT_00e691e0;
  auVar26[0] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x10] == DAT_00e691e0);
  auVar26[1] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x11] ==
                DAT_00e691e0._1_1_);
  auVar26[2] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x12] ==
                DAT_00e691e0._2_1_);
  auVar26[3] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x13] ==
                DAT_00e691e0._3_1_);
  auVar26[4] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x14] ==
                DAT_00e691e0._4_1_);
  auVar26[5] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x15] ==
                DAT_00e691e0._5_1_);
  auVar26[6] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x16] ==
                DAT_00e691e0._6_1_);
  auVar26[7] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x17] ==
                DAT_00e691e0._7_1_);
  auVar26[8] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x18] ==
                DAT_00e691e0._8_1_);
  auVar26[9] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x19] ==
                DAT_00e691e0._9_1_);
  auVar26[10] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                 DAT_00e691e0._10_1_);
  auVar26[0xb] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                  DAT_00e691e0._11_1_);
  auVar26[0xc] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                  DAT_00e691e0._12_1_);
  auVar26[0xd] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                  DAT_00e691e0._13_1_);
  auVar26[0xe] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                  DAT_00e691e0._14_1_);
  auVar26[0xf] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                  DAT_00e691e0._15_1_);
  auVar19[0] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0] == DAT_00e691d0);
  auVar19[1] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[1] == DAT_00e691d0._1_1_)
  ;
  auVar19[2] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[2] == DAT_00e691d0._2_1_)
  ;
  auVar19[3] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[3] == DAT_00e691d0._3_1_)
  ;
  auVar19[4] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[4] == DAT_00e691d0._4_1_)
  ;
  auVar19[5] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[5] == DAT_00e691d0._5_1_)
  ;
  auVar19[6] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[6] == DAT_00e691d0._6_1_)
  ;
  auVar19[7] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[7] == DAT_00e691d0._7_1_)
  ;
  auVar19[8] = -((bool)(local_a08->second).super_base_blob<256U>.m_data._M_elems[8] ==
                DAT_00e691d0._8_1_);
  auVar19[9] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[9] == DAT_00e691d0._9_1_)
  ;
  auVar19[10] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[10] ==
                 DAT_00e691d0._10_1_);
  auVar19[0xb] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xb] ==
                  DAT_00e691d0._11_1_);
  auVar19[0xc] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xc] ==
                  DAT_00e691d0._12_1_);
  auVar19[0xd] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xd] ==
                  DAT_00e691d0._13_1_);
  auVar19[0xe] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xe] ==
                  DAT_00e691d0._14_1_);
  auVar19[0xf] = -((local_a08->second).super_base_blob<256U>.m_data._M_elems[0xf] ==
                  DAT_00e691d0._15_1_);
  auVar19 = auVar19 & auVar26;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_dc0._0_8_ =
       "merkleBlock.vMatchedTxn[0].second == uint256{\"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041\"}"
  ;
  local_dc0.m_message.px = (element_type *)0xe69ecc;
  sStack_ac0.px = (element_type *)(sStack_ac0._1_8_ << 8);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_ac0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e58 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_ab0 = &local_dc0;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar35,(size_t)&local_e60,0x18e);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_e70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e68 = "";
  local_e80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x18f;
  file_09.m_begin = (iterator)&local_e70;
  msg_09.m_end = pvVar12;
  msg_09.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_e80,
             msg_09);
  sStack_ac0.px = (element_type *)0x0;
  sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn[0].first == 3";
  local_de0.m_message.px = (element_type *)0xe69ef2;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_e90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e88 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  local_ac8[0] = (class_property<bool>)(class_property<bool>)(local_a08->first == 3);
  unique0x10004ce7 = &local_de0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_e90,399);
  boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
  local_ea0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_e98 = "";
  local_eb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ea8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x191;
  file_10.m_begin = (iterator)&local_ea0;
  msg_10.m_end = pvVar12;
  msg_10.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_eb0,
             msg_10);
  if (local_a08[1].first == local_af8._0_4_) {
    auVar32[0] = -(local_af8[4] == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0]);
    auVar32[1] = -(local_af8[5] == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[1]);
    auVar32[2] = -(local_af8[6] == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[2]);
    auVar32[3] = -(local_af8[7] == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[3]);
    auVar32[4] = -((uchar)sStack_af0.px ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[4]);
    auVar32[5] = -(sStack_af0.px._1_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[5]);
    auVar32[6] = -(sStack_af0.px._2_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[6]);
    auVar32[7] = -(sStack_af0.px._3_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[7]);
    auVar32[8] = -(sStack_af0.px._4_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[8]);
    auVar32[9] = -(sStack_af0.px._5_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[9]);
    auVar32[10] = -(sStack_af0.px._6_1_ ==
                   local_a08[1].second.super_base_blob<256U>.m_data._M_elems[10]);
    auVar32[0xb] = -(sStack_af0.px._7_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar32[0xc] = -((uchar)sStack_af0.pn.pi_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar32[0xd] = -(sStack_af0.pn.pi_._1_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar32[0xe] = -(sStack_af0.pn.pi_._2_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar32[0xf] = -(sStack_af0.pn.pi_._3_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar20[0] = -(sStack_af0.pn.pi_._4_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x10]);
    auVar20[1] = -(sStack_af0.pn.pi_._5_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x11]);
    auVar20[2] = -(sStack_af0.pn.pi_._6_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x12]);
    auVar20[3] = -(sStack_af0.pn.pi_._7_1_ ==
                  local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x13]);
    auVar20[4] = -(uStack_ae0 == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x14]);
    auVar20[5] = -(uStack_adf == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x15]);
    auVar20[6] = -(uStack_ade == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x16]);
    auVar20[7] = -(uStack_add == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x17]);
    auVar20[8] = -(uStack_adc == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x18]);
    auVar20[9] = -(uStack_adb == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x19]);
    auVar20[10] = -(uStack_ada == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar20[0xb] = -(uStack_ad9 == local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar20[0xc] = -((uchar)local_ad8 ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar20[0xd] = -(local_ad8._1_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar20[0xe] = -(local_ad8._2_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar20[0xf] = -(local_ad8._3_1_ ==
                    local_a08[1].second.super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar20 = auVar20 & auVar32;
    local_ac8[0] = (class_property<bool>)
                   ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
  }
  else {
    local_ac8[0] = (class_property<bool>)false;
  }
  sStack_ac0.px = (element_type *)0x0;
  sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "merkleBlock.vMatchedTxn[1] == pair";
  local_de0.m_message.px = (element_type *)0xe698b7;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffff460 = &local_de0;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_ec0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_eb8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_ec0,0x191);
  boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
  local_ed0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_ec8 = "";
  local_ee0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x193;
  file_11.m_begin = (iterator)&local_ed0;
  msg_11.m_end = pvVar12;
  msg_11.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_ee0,
             msg_11);
  CPartialMerkleTree::ExtractMatches
            ((uint256 *)local_bb8,&local_a58,&local_cd8,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_cf8);
  auVar27[0] = -((class_property<bool>)local_88[4] == local_bb8[0]);
  auVar27[1] = -(local_88[5] == local_bb8[1]);
  auVar27[2] = -(local_88[6] == local_bb8[2]);
  auVar27[3] = -(local_88[7] == local_bb8[3]);
  auVar27[4] = -(local_88[8] == local_bb8[4]);
  auVar27[5] = -(local_88[9] == local_bb8[5]);
  auVar27[6] = -(local_88[10] == local_bb8[6]);
  auVar27[7] = -(local_88[0xb] == local_bb8[7]);
  auVar27[8] = -(local_88[0xc] == local_bb8[8]);
  auVar27[9] = -(local_88[0xd] == local_bb8[9]);
  auVar27[10] = -(local_88[0xe] == local_bb8[10]);
  auVar27[0xb] = -(local_88[0xf] == local_bb8[0xb]);
  auVar27[0xc] = -(local_78[0] == local_bb8[0xc]);
  auVar27[0xd] = -(local_78[1] == local_bb8[0xd]);
  auVar27[0xe] = -(local_78[2] == local_bb8[0xe]);
  auVar27[0xf] = -(local_78[3] == local_bb8[0xf]);
  auVar33[0] = -(local_78[4] == local_ba8[0]);
  auVar33[1] = -(local_78[5] == local_ba8[1]);
  auVar33[2] = -(local_78[6] == local_ba8[2]);
  auVar33[3] = -(local_78[7] == local_ba8[3]);
  auVar33[4] = -(local_78[8] == local_ba8[4]);
  auVar33[5] = -(local_78[9] == local_ba8[5]);
  auVar33[6] = -(local_78[10] == local_ba8[6]);
  auVar33[7] = -(local_78[0xb] == local_ba8[7]);
  auVar33[8] = -(local_78[0xc] == local_ba8[8]);
  auVar33[9] = -(local_78[0xd] == uStack_b9f);
  auVar33[10] = -(local_78[0xe] == uStack_b9e);
  auVar33[0xb] = -(local_78[0xf] == uStack_b9d);
  auVar33[0xc] = -(local_68[0] == uStack_b9c);
  auVar33[0xd] = -(local_68[1] == uStack_b9b);
  auVar33[0xe] = -(local_68[2] == uStack_b9a);
  auVar33[0xf] = -(local_68[3] == uStack_b99);
  auVar27 = auVar27 & auVar33;
  local_de0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) == 0xffff);
  local_de0.m_message.px = (element_type *)0x0;
  local_de0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_dc0._0_8_ = "merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot";
  local_dc0.m_message.px = (element_type *)0xe697dd;
  sStack_ac0.px = (element_type *)(sStack_ac0._1_8_ << 8);
  local_ac8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  sStack_ac0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_ef0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_ee8 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  uStack_ab0 = &local_dc0;
  boost::test_tools::tt_detail::report_assertion
            (&local_de0,(lazy_ostream *)local_ac8,1,0,WARN,_cVar35,(size_t)&local_ef0,0x193);
  boost::detail::shared_count::~shared_count(&local_de0.m_message.pn);
  local_f00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_ef8 = "";
  local_f10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x194;
  file_12.m_begin = (iterator)&local_f00;
  msg_12.m_end = pvVar12;
  msg_12.m_begin = pvVar11;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_f10,
             msg_12);
  local_ac8[0] = (class_property<bool>)
                 (class_property<bool>)
                 ((long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start >> 5 ==
                 ((long)ppStack_a00 - (long)local_a08 >> 2) * -0x71c71c71c71c71c7);
  sStack_ac0.px = (element_type *)0x0;
  sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
  local_de0._0_8_ = "vMatched.size() == merkleBlock.vMatchedTxn.size()";
  local_de0.m_message.px = (element_type *)0xe6980f;
  local_bb8[8] = 0;
  local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
  stack0xfffffffffffff460 = &local_de0;
  local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_f20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
  ;
  local_f18 = "";
  pvVar11 = (iterator)0x1;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,_cVar35,
             (size_t)&local_f20,0x194);
  boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
  if (local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar15 = 1;
    do {
      local_f30 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/bloom_tests.cpp"
      ;
      local_f28 = "";
      local_f40 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f38 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x196;
      file_13.m_begin = (iterator)&local_f30;
      msg_13.m_end = pvVar12;
      msg_13.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_f40,
                 msg_13);
      puVar1 = local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start + uVar14;
      auVar17 = *(undefined1 (*) [16])
                 (local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14].super_base_blob<256U>.m_data._M_elems +
                 0x10);
      puVar2 = &local_a08[uVar14].second;
      auVar34[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
      auVar34[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
      auVar34[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
      auVar34[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
      auVar34[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
      auVar34[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
      auVar34[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
      auVar34[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
      auVar34[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[8]);
      auVar34[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] ==
                    (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
      auVar34[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] ==
                     (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
      auVar34[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
      auVar34[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
      auVar34[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
      auVar34[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
      auVar34[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] ==
                      (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
      puVar3 = local_a08[uVar14].second.super_base_blob<256U>.m_data._M_elems + 0x10;
      auVar21[0] = -(*puVar3 == auVar17[0]);
      auVar21[1] = -(puVar3[1] == auVar17[1]);
      auVar21[2] = -(puVar3[2] == auVar17[2]);
      auVar21[3] = -(puVar3[3] == auVar17[3]);
      auVar21[4] = -(puVar3[4] == auVar17[4]);
      auVar21[5] = -(puVar3[5] == auVar17[5]);
      auVar21[6] = -(puVar3[6] == auVar17[6]);
      auVar21[7] = -(puVar3[7] == auVar17[7]);
      auVar21[8] = -(puVar3[8] == auVar17[8]);
      auVar21[9] = -(puVar3[9] == auVar17[9]);
      auVar21[10] = -(puVar3[10] == auVar17[10]);
      auVar21[0xb] = -(puVar3[0xb] == auVar17[0xb]);
      auVar21[0xc] = -(puVar3[0xc] == auVar17[0xc]);
      auVar21[0xd] = -(puVar3[0xd] == auVar17[0xd]);
      auVar21[0xe] = -(puVar3[0xe] == auVar17[0xe]);
      auVar21[0xf] = -(puVar3[0xf] == auVar17[0xf]);
      auVar21 = auVar21 & auVar34;
      local_ac8[0] = (class_property<bool>)
                     (class_property<bool>)
                     ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                              (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
      sStack_ac0.px = (element_type *)0x0;
      sStack_ac0.pn.pi_ = (sp_counted_base *)0x0;
      local_de0._0_8_ = "vMatched[i] == merkleBlock.vMatchedTxn[i].second";
      local_de0.m_message.px = (element_type *)0xe69840;
      local_bb8[8] = 0;
      local_bb8._0_8_ = &PTR__lazy_ostream_013abc70;
      stack0xfffffffffffff460 = &local_de0;
      local_ba8._0_8_ = boost::unit_test::lazy_ostream::inst;
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_ac8,(lazy_ostream *)local_bb8,1,0,WARN,0xe691fc,
                 (size_t)&stack0xfffffffffffff0b0,0x196);
      boost::detail::shared_count::~shared_count(&sStack_ac0.pn);
      bVar4 = uVar15 < (ulong)((long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar14 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar4);
  }
  if ((pointer)local_cf8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_cf8._0_8_,(long)local_ce8 - local_cf8._0_8_);
  }
  if (local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_cd8.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a08 != (pointer)0x0) {
    operator_delete(local_a08,(long)local_9f8 - (long)local_a08);
  }
  if (local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a58.vHash.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._8_8_ =
         local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
         ._M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
         ._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_a58.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_be0.vData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_be0.vData.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_be0.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_be0.vData.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c00);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_block_4)
{
    // Random real block (000000000000b731f2eef9e8c63173adfb07e41bd53eb0ef0a6b720d6cb6dea4)
    // With 7 txes
    CBlock block;
    DataStream stream{
        "0100000082bb869cf3a793432a66e826e05a6fc37469f8efb7421dc880670100000000007f16c5962e8bd963659c793ce370d95f093bc7e367117b3c30c1f8fdd0d9728776381b4d4c86041b554b85290701000000010000000000000000000000000000000000000000000000000000000000000000ffffffff07044c86041b0136ffffffff0100f2052a01000000434104eaafc2314def4ca98ac970241bcab022b9c1e1f4ea423a20f134c876f2c01ec0f0dd5b2e86e7168cefe0d81113c3807420ce13ad1357231a2252247d97a46a91ac000000000100000001bcad20a6a29827d1424f08989255120bf7f3e9e3cdaaa6bb31b0737fe048724300000000494830450220356e834b046cadc0f8ebb5a8a017b02de59c86305403dad52cd77b55af062ea10221009253cd6c119d4729b77c978e1e2aa19f5ea6e0e52b3f16e32fa608cd5bab753901ffffffff02008d380c010000001976a9142b4b8072ecbba129b6453c63e129e643207249ca88ac0065cd1d000000001976a9141b8dd13b994bcfc787b32aeadf58ccb3615cbd5488ac000000000100000003fdacf9b3eb077412e7a968d2e4f11b9a9dee312d666187ed77ee7d26af16cb0b000000008c493046022100ea1608e70911ca0de5af51ba57ad23b9a51db8d28f82c53563c56a05c20f5a87022100a8bdc8b4a8acc8634c6b420410150775eb7f2474f5615f7fccd65af30f310fbf01410465fdf49e29b06b9a1582287b6279014f834edc317695d125ef623c1cc3aaece245bd69fcad7508666e9c74a49dc9056d5fc14338ef38118dc4afae5fe2c585caffffffff309e1913634ecb50f3c4f83e96e70b2df071b497b8973a3e75429df397b5af83000000004948304502202bdb79c596a9ffc24e96f4386199aba386e9bc7b6071516e2b51dda942b3a1ed022100c53a857e76b724fc14d45311eac5019650d415c3abb5428f3aae16d8e69bec2301ffffffff2089e33491695080c9edc18a428f7d834db5b6d372df13ce2b1b0e0cbcb1e6c10000000049483045022100d4ce67c5896ee251c810ac1ff9ceccd328b497c8f553ab6e08431e7d40bad6b5022033119c0c2b7d792d31f1187779c7bd95aefd93d90a715586d73801d9b47471c601ffffffff0100714460030000001976a914c7b55141d097ea5df7a0ed330cf794376e53ec8d88ac0000000001000000045bf0e214aa4069a3e792ecee1e1bf0c1d397cde8dd08138f4b72a00681743447000000008b48304502200c45de8c4f3e2c1821f2fc878cba97b1e6f8807d94930713aa1c86a67b9bf1e40221008581abfef2e30f957815fc89978423746b2086375ca8ecf359c85c2a5b7c88ad01410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffffd669f7d7958d40fc59d2253d88e0f248e29b599c80bbcec344a83dda5f9aa72c000000008a473044022078124c8beeaa825f9e0b30bff96e564dd859432f2d0cb3b72d3d5d93d38d7e930220691d233b6c0f995be5acb03d70a7f7a65b6bc9bdd426260f38a1346669507a3601410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95fffffffff878af0d93f5229a68166cf051fd372bb7a537232946e0a46f53636b4dafdaa4000000008c493046022100c717d1714551663f69c3c5759bdbb3a0fcd3fab023abc0e522fe6440de35d8290221008d9cbe25bffc44af2b18e81c58eb37293fd7fe1c2e7b46fc37ee8c96c50ab1e201410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff27f2b668859cd7f2f894aa0fd2d9e60963bcd07c88973f425f999b8cbfd7a1e2000000008c493046022100e00847147cbf517bcc2f502f3ddc6d284358d102ed20d47a8aa788a62f0db780022100d17b2d6fa84dcaf1c95d88d7e7c30385aecf415588d749afd3ec81f6022cecd701410462bb73f76ca0994fcb8b4271e6fb7561f5c0f9ca0cf6485261c4a0dc894f4ab844c6cdfb97cd0b60ffb5018ffd6238f4d87270efb1d3ae37079b794a92d7ec95ffffffff0100c817a8040000001976a914b6efd80d99179f4f4ff6f4dd0a007d018c385d2188ac000000000100000001834537b2f1ce8ef9373a258e10545ce5a50b758df616cd4356e0032554ebd3c4000000008b483045022100e68f422dd7c34fdce11eeb4509ddae38201773dd62f284e8aa9d96f85099d0b002202243bd399ff96b649a0fad05fa759d6a882f0af8c90cf7632c2840c29070aec20141045e58067e815c2f464c6a2a15f987758374203895710c2d452442e28496ff38ba8f5fd901dc20e29e88477167fe4fc299bf818fd0d9e1632d467b2a3d9503b1aaffffffff0280d7e636030000001976a914f34c3e10eb387efe872acb614c89e78bfca7815d88ac404b4c00000000001976a914a84e272933aaf87e1715d7786c51dfaeb5b65a6f88ac00000000010000000143ac81c8e6f6ef307dfe17f3d906d999e23e0189fda838c5510d850927e03ae7000000008c4930460221009c87c344760a64cb8ae6685a3eec2c1ac1bed5b88c87de51acd0e124f266c16602210082d07c037359c3a257b5c63ebd90f5a5edf97b2ac1c434b08ca998839f346dd40141040ba7e521fa7946d12edbb1d1e95a15c34bd4398195e86433c92b431cd315f455fe30032ede69cad9d1e1ed6c3c4ec0dbfced53438c625462afb792dcb098544bffffffff0240420f00000000001976a9144676d1b820d63ec272f1900d59d43bc6463d96f888ac40420f00000000001976a914648d04341d00d7968b3405c034adc38d4d8fb9bd88ac00000000010000000248cc917501ea5c55f4a8d2009c0567c40cfe037c2e71af017d0a452ff705e3f1000000008b483045022100bf5fdc86dc5f08a5d5c8e43a8c9d5b1ed8c65562e280007b52b133021acd9acc02205e325d613e555f772802bf413d36ba807892ed1a690a77811d3033b3de226e0a01410429fa713b124484cb2bd7b5557b2c0b9df7b2b1fee61825eadc5ae6c37a9920d38bfccdc7dc3cb0c47d7b173dbc9db8d37db0a33ae487982c59c6f8606e9d1791ffffffff41ed70551dd7e841883ab8f0b16bf04176b7d1480e4f0af9f3d4c3595768d068000000008b4830450221008513ad65187b903aed1102d1d0c47688127658c51106753fed0151ce9c16b80902201432b9ebcb87bd04ceb2de66035fbbaf4bf8b00d1cfe41f1a1f7338f9ad79d210141049d4cf80125bf50be1709f718c07ad15d0fc612b7da1f5570dddc35f2a352f0f27c978b06820edca9ef982c35fda2d255afba340068c5035552368bc7200c1488ffffffff0100093d00000000001976a9148edb68822f1ad580b043c7b3df2e400f8699eb4888ac00000000"_hex,
    };
    stream >> TX_WITH_WITNESS(block);

    CBloomFilter filter(10, 0.000001, 0, BLOOM_UPDATE_ALL);
    // Match the last transaction
    filter.insert(uint256{"0a2a92f0bda4727d0a13eaddf4dd9ac6b5c61a1429e6b2b818f19b15df0ac154"});

    CMerkleBlock merkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 1);
    std::pair<unsigned int, uint256> pair = merkleBlock.vMatchedTxn[0];

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"0a2a92f0bda4727d0a13eaddf4dd9ac6b5c61a1429e6b2b818f19b15df0ac154"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 6);

    std::vector<uint256> vMatched;
    std::vector<unsigned int> vIndex;
    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);

    // Also match the 4th transaction
    filter.insert(uint256{"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041"});
    merkleBlock = CMerkleBlock(block, filter);
    BOOST_CHECK(merkleBlock.header.GetHash() == block.GetHash());

    BOOST_CHECK(merkleBlock.vMatchedTxn.size() == 2);

    BOOST_CHECK(merkleBlock.vMatchedTxn[0].second == uint256{"02981fa052f0481dbc5868f4fc2166035a10f27a03cfd2de67326471df5bc041"});
    BOOST_CHECK(merkleBlock.vMatchedTxn[0].first == 3);

    BOOST_CHECK(merkleBlock.vMatchedTxn[1] == pair);

    BOOST_CHECK(merkleBlock.txn.ExtractMatches(vMatched, vIndex) == block.hashMerkleRoot);
    BOOST_CHECK(vMatched.size() == merkleBlock.vMatchedTxn.size());
    for (unsigned int i = 0; i < vMatched.size(); i++)
        BOOST_CHECK(vMatched[i] == merkleBlock.vMatchedTxn[i].second);
}